

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprListDelete(sqlite3 *db,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  
  if (pList != (ExprList *)0x0) {
    if (0 < pList->nExpr) {
      pEVar2 = pList->a;
      iVar1 = 0;
      do {
        sqlite3ExprDelete(db,pEVar2->pExpr);
        sqlite3DbFree(db,pEVar2->zName);
        sqlite3DbFree(db,pEVar2->zSpan);
        iVar1 = iVar1 + 1;
        pEVar2 = pEVar2 + 1;
      } while (iVar1 < pList->nExpr);
    }
    sqlite3DbFree(db,pList->a);
    sqlite3DbFree(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListDelete(sqlite3 *db, ExprList *pList){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return;
  assert( pList->a!=0 || pList->nExpr==0 );
  for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
    sqlite3ExprDelete(db, pItem->pExpr);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zSpan);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFree(db, pList);
}